

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_singleton.h
# Opt level: O3

void __thiscall
singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,__ze_rtas_parallel_operation_exp_handle_t_*>
::release(singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,__ze_rtas_parallel_operation_exp_handle_t_*>
          *this,_ze_rtas_parallel_operation_exp_handle_t *_key)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,_std::default_delete<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,_std::default_delete<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->map)._M_h);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void release( _key_t _key )
    {
        std::lock_guard<std::mutex> lk( mut );
        map.erase( getKey( _key ) );
    }